

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BooleanStateQueryTests::deinit(BooleanStateQueryTests *this)

{
  BooleanStateQueryTests *this_local;
  
  if (this->m_verifierIsEnabled != (IsEnabledVerifier *)0x0) {
    if (this->m_verifierIsEnabled != (IsEnabledVerifier *)0x0) {
      (*(this->m_verifierIsEnabled->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierIsEnabled = (IsEnabledVerifier *)0x0;
  }
  if (this->m_verifierBoolean != (GetBooleanVerifier *)0x0) {
    if (this->m_verifierBoolean != (GetBooleanVerifier *)0x0) {
      (*(this->m_verifierBoolean->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierBoolean = (GetBooleanVerifier *)0x0;
  }
  if (this->m_verifierInteger != (GetIntegerVerifier *)0x0) {
    if (this->m_verifierInteger != (GetIntegerVerifier *)0x0) {
      (*(this->m_verifierInteger->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierInteger = (GetIntegerVerifier *)0x0;
  }
  if (this->m_verifierFloat != (GetFloatVerifier *)0x0) {
    if (this->m_verifierFloat != (GetFloatVerifier *)0x0) {
      (*(this->m_verifierFloat->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierFloat = (GetFloatVerifier *)0x0;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void BooleanStateQueryTests::deinit (void)
{
	if (m_verifierIsEnabled)
	{
		delete m_verifierIsEnabled;
		m_verifierIsEnabled = DE_NULL;
	}
	if (m_verifierBoolean)
	{
		delete m_verifierBoolean;
		m_verifierBoolean = DE_NULL;
	}
	if (m_verifierInteger)
	{
		delete m_verifierInteger;
		m_verifierInteger = DE_NULL;
	}
	if (m_verifierFloat)
	{
		delete m_verifierFloat;
		m_verifierFloat = DE_NULL;
	}

	this->TestCaseGroup::deinit();
}